

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# upnpapi.c
# Opt level: O1

int UpnpSubscribe(UpnpClient_Handle Hnd,char *EvtUrl_const,int *TimeOut,char *SubsId)

{
  Upnp_Handle_Type UVar1;
  uint uVar2;
  UpnpString *p;
  UpnpString *p_00;
  char *pcVar3;
  Handle_Info **HndInfo;
  ulong uVar4;
  Handle_Info *SInfo;
  Handle_Info *local_38;
  
  local_38 = (Handle_Info *)0x0;
  p = UpnpString_new();
  p_00 = UpnpString_new();
  UpnpPrintf(UPNP_ALL,API,".upnp/src/api/upnpapi.c",0x8e5,"Inside UpnpSubscribe\n");
  uVar4 = 0xffffff8c;
  if ((UpnpSdkInit != 1) || (uVar4 = 0xffffff98, p == (UpnpString *)0x0)) goto LAB_00106d05;
  if (EvtUrl_const != (char *)0x0) {
    UpnpString_set_String(p,EvtUrl_const);
    if (p_00 == (UpnpString *)0x0) goto LAB_00106d05;
    if (SubsId != (char *)0x0) {
      pcVar3 = SubsId;
      UpnpString_set_String(p_00,SubsId);
      uVar4 = 0xffffff9b;
      if (TimeOut != (int *)0x0) {
        HandleReadLock((char *)0x905,(int)pcVar3);
        HndInfo = &local_38;
        UVar1 = GetHandleInfo(Hnd,HndInfo);
        if (UVar1 == HND_CLIENT) {
          HandleUnlock((char *)0x90e,(int)HndInfo);
          uVar2 = genaSubscribe(Hnd,p,TimeOut,p_00);
          uVar4 = (ulong)uVar2;
          SubsId[0] = '\0';
          SubsId[1] = '\0';
          SubsId[2] = '\0';
          SubsId[3] = '\0';
          SubsId[4] = '\0';
          SubsId[5] = '\0';
          SubsId[6] = '\0';
          SubsId[7] = '\0';
          SubsId[8] = '\0';
          SubsId[9] = '\0';
          SubsId[10] = '\0';
          SubsId[0xb] = '\0';
          SubsId[0xc] = '\0';
          SubsId[0xd] = '\0';
          SubsId[0xe] = '\0';
          SubsId[0xf] = '\0';
          SubsId[0x10] = '\0';
          SubsId[0x11] = '\0';
          SubsId[0x12] = '\0';
          SubsId[0x13] = '\0';
          SubsId[0x14] = '\0';
          SubsId[0x15] = '\0';
          SubsId[0x16] = '\0';
          SubsId[0x17] = '\0';
          SubsId[0x18] = '\0';
          SubsId[0x19] = '\0';
          SubsId[0x1a] = '\0';
          SubsId[0x1b] = '\0';
          SubsId[0x1c] = '\0';
          SubsId[0x1d] = '\0';
          SubsId[0x1e] = '\0';
          SubsId[0x1f] = '\0';
          SubsId[0x1c] = '\0';
          SubsId[0x1d] = '\0';
          SubsId[0x1e] = '\0';
          SubsId[0x1f] = '\0';
          SubsId[0x20] = '\0';
          SubsId[0x21] = '\0';
          SubsId[0x22] = '\0';
          SubsId[0x23] = '\0';
          SubsId[0x24] = '\0';
          SubsId[0x25] = '\0';
          SubsId[0x26] = '\0';
          SubsId[0x27] = '\0';
          SubsId[0x28] = '\0';
          SubsId[0x29] = '\0';
          SubsId[0x2a] = '\0';
          SubsId[0x2b] = '\0';
          pcVar3 = UpnpString_get_String(p_00);
          strncpy(SubsId,pcVar3,0x2b);
        }
        else {
          HandleUnlock((char *)0x90a,(int)HndInfo);
          uVar4 = 0xffffff9c;
        }
      }
      goto LAB_00106d05;
    }
  }
  uVar4 = 0xffffff9b;
LAB_00106d05:
  UpnpPrintf(UPNP_ALL,API,".upnp/src/api/upnpapi.c",0x918,"Exiting UpnpSubscribe, retVal=%d\n",uVar4
            );
  UpnpString_delete(p_00);
  UpnpString_delete(p);
  return (int)uVar4;
}

Assistant:

int UpnpSubscribe(UpnpClient_Handle Hnd,
	const char *EvtUrl_const,
	int *TimeOut,
	Upnp_SID SubsId)
{
	int retVal;
	struct Handle_Info *SInfo = NULL;
	UpnpString *EvtUrl = UpnpString_new();
	UpnpString *SubsIdTmp = UpnpString_new();

	UpnpPrintf(UPNP_ALL, API, __FILE__, __LINE__, "Inside UpnpSubscribe\n");

	if (UpnpSdkInit != 1) {
		retVal = UPNP_E_FINISH;
		goto exit_function;
	}

	if (EvtUrl == NULL) {
		retVal = UPNP_E_OUTOF_MEMORY;
		goto exit_function;
	}
	if (EvtUrl_const == NULL) {
		retVal = UPNP_E_INVALID_PARAM;
		goto exit_function;
	}
	UpnpString_set_String(EvtUrl, EvtUrl_const);

	if (SubsIdTmp == NULL) {
		retVal = UPNP_E_OUTOF_MEMORY;
		goto exit_function;
	}
	if (SubsId == NULL) {
		retVal = UPNP_E_INVALID_PARAM;
		goto exit_function;
	}
	UpnpString_set_String(SubsIdTmp, SubsId);

	if (TimeOut == NULL) {
		retVal = UPNP_E_INVALID_PARAM;
		goto exit_function;
	}

	HandleReadLock(__FILE__, __LINE__);
	switch (GetHandleInfo(Hnd, &SInfo)) {
	case HND_CLIENT:
		break;
	default:
		HandleUnlock(__FILE__, __LINE__);
		retVal = UPNP_E_INVALID_HANDLE;
		goto exit_function;
	}
	HandleUnlock(__FILE__, __LINE__);

	retVal = genaSubscribe(Hnd, EvtUrl, TimeOut, SubsIdTmp);
	memset(SubsId, 0, sizeof(Upnp_SID));
	strncpy(SubsId, UpnpString_get_String(SubsIdTmp), sizeof(Upnp_SID) - 1);

exit_function:
	UpnpPrintf(UPNP_ALL,
		API,
		__FILE__,
		__LINE__,
		"Exiting UpnpSubscribe, retVal=%d\n",
		retVal);

	UpnpString_delete(SubsIdTmp);
	UpnpString_delete(EvtUrl);

	return retVal;
}